

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::~SPxBasisBase(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  
  ~SPxBasisBase(in_RDI);
  operator_delete(in_RDI,0x280);
  return;
}

Assistant:

SPxBasisBase<R>::~SPxBasisBase()
{

   assert(!freeSlinSolver || factor != nullptr);

   if(freeSlinSolver)
   {
      delete factor;
      factor = nullptr;
   }

   theTime->~Timer();
   spx_free(theTime);
}